

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O1

Vec_Int_t ** Ssw_TransformPairsIntoTempClasses(Vec_Int_t *vPairs,int nObjNumMax)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Vec_Int_t **ppVVar5;
  void *__s;
  Vec_Int_t *pVVar6;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long local_38;
  
  ppVVar5 = (Vec_Int_t **)calloc((long)nObjNumMax,8);
  __s = malloc((long)nObjNumMax * 4);
  if (0 < nObjNumMax) {
    memset(__s,0xff,(ulong)(uint)nObjNumMax << 2);
  }
  iVar4 = vPairs->nSize;
  if (0 < iVar4) {
    uVar13 = 0;
    do {
      if (((int)uVar13 < 0) || (uVar9 = (int)uVar13 + 1, iVar4 <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = vPairs->pArray[uVar9];
      lVar12 = (long)iVar4;
      if (lVar12 < 1) {
        __assert_fail("idObj > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                      ,0xa5,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
      }
      uVar9 = vPairs->pArray[uVar13];
      lVar10 = (long)(int)uVar9;
      uVar1 = *(uint *)((long)__s + lVar10 * 4);
      lVar11 = (long)(int)uVar1;
      if (((ulong)uVar1 != 0xffffffff) && (ppVVar5[lVar11] == (Vec_Int_t *)0x0)) {
        __assert_fail("(pReprs[idRepr] == -1) || (pvClasses[pReprs[idRepr]] != NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                      ,0xa6,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
      }
      uVar2 = *(uint *)((long)__s + lVar12 * 4);
      uVar8 = (ulong)uVar2;
      local_38 = (long)(int)uVar2;
      if ((uVar8 != 0xffffffff) && (ppVVar5[local_38] == (Vec_Int_t *)0x0)) {
        __assert_fail("(pReprs[idObj] == -1) || (pvClasses[pReprs[idObj] ] != NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                      ,0xa7,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
      }
      if ((uVar2 & uVar1) == 0xffffffff) {
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 0x10;
        pVVar6->nSize = 0;
        piVar7 = (int *)malloc(0x40);
        pVVar6->pArray = piVar7;
        ppVVar5[lVar10] = pVVar6;
        Vec_IntPush(pVVar6,uVar9);
        Vec_IntPush(pVVar6,iVar4);
        *(uint *)((long)__s + lVar10 * 4) = uVar9;
        *(uint *)((long)__s + lVar12 * 4) = uVar9;
      }
      else if (((int)uVar1 < 0) || (uVar2 != 0xffffffff)) {
        if ((uVar1 == 0xffffffff) && (-1 < (int)uVar2)) {
          if (uVar2 == uVar9) {
            __assert_fail("idReprObj != idRepr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                          ,0xbd,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
          }
          pVVar6 = ppVVar5[uVar8];
          if ((int)uVar2 < (int)uVar9) {
            Vec_IntPushUniqueOrder(pVVar6,uVar9);
            *(uint *)((long)__s + lVar10 * 4) = uVar2;
          }
          else {
            uVar1 = pVVar6->nCap;
            if (pVVar6->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar6->pArray == (int *)0x0) {
                  piVar7 = (int *)malloc(0x40);
                }
                else {
                  piVar7 = (int *)realloc(pVVar6->pArray,0x40);
                }
                pVVar6->pArray = piVar7;
                iVar4 = 0x10;
              }
              else {
                iVar4 = uVar1 * 2;
                if (iVar4 <= (int)uVar1) goto LAB_005e92b4;
                if (pVVar6->pArray == (int *)0x0) {
                  piVar7 = (int *)malloc((ulong)uVar1 << 3);
                }
                else {
                  piVar7 = (int *)realloc(pVVar6->pArray,(ulong)uVar1 << 3);
                }
                pVVar6->pArray = piVar7;
              }
              if (piVar7 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar6->nCap = iVar4;
            }
LAB_005e92b4:
            iVar4 = pVVar6->nSize;
            pVVar6->nSize = iVar4 + 1;
            if (0 < (long)iVar4) {
              memmove(pVVar6->pArray + 1,pVVar6->pArray,(long)iVar4 << 2);
            }
            *pVVar6->pArray = uVar9;
            ppVVar5[lVar10] = pVVar6;
            ppVVar5[uVar8] = (Vec_Int_t *)0x0;
            uVar8 = (ulong)ppVVar5[lVar10]->nSize;
            if ((long)uVar8 < 1) {
              uVar13 = 0;
            }
            else {
              piVar7 = ppVVar5[lVar10]->pArray;
              uVar13 = 0;
              do {
                *(uint *)((long)__s + (long)piVar7[uVar13] * 4) = uVar9;
                uVar13 = uVar13 + 1;
              } while (uVar8 != uVar13);
            }
          }
        }
        else if (uVar1 != uVar2) {
          if ((int)uVar1 < (int)uVar2) {
            pVVar6 = ppVVar5[local_38];
            lVar12 = local_38;
            if (pVVar6->nSize < 1) {
LAB_005e920e:
              local_38 = lVar12;
              uVar13 = 0;
            }
            else {
              pVVar3 = ppVVar5[lVar11];
              uVar13 = 0;
              do {
                iVar4 = pVVar6->pArray[uVar13];
                Vec_IntPushUniqueOrder(pVVar3,iVar4);
                *(uint *)((long)__s + (long)iVar4 * 4) = uVar1;
                uVar13 = uVar13 + 1;
              } while ((long)uVar13 < (long)pVVar6->nSize);
            }
          }
          else {
            pVVar6 = ppVVar5[lVar11];
            lVar12 = lVar11;
            if (pVVar6->nSize < 1) goto LAB_005e920e;
            pVVar3 = ppVVar5[local_38];
            uVar13 = 0;
            do {
              iVar4 = pVVar6->pArray[uVar13];
              Vec_IntPushUniqueOrder(pVVar3,iVar4);
              *(uint *)((long)__s + (long)iVar4 * 4) = uVar2;
              uVar13 = uVar13 + 1;
              local_38 = lVar11;
            } while ((long)uVar13 < (long)pVVar6->nSize);
          }
          if (pVVar6->pArray != (int *)0x0) {
            free(pVVar6->pArray);
            pVVar6->pArray = (int *)0x0;
          }
          if (pVVar6 != (Vec_Int_t *)0x0) {
            free(pVVar6);
          }
          ppVVar5[local_38] = (Vec_Int_t *)0x0;
        }
      }
      else {
        Vec_IntPushUniqueOrder(ppVVar5[uVar1],iVar4);
        *(uint *)((long)__s + lVar12 * 4) = uVar1;
      }
      uVar9 = (int)uVar13 + 2;
      uVar13 = (ulong)uVar9;
      iVar4 = vPairs->nSize;
    } while ((int)uVar9 < iVar4);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return ppVVar5;
}

Assistant:

Vec_Int_t ** Ssw_TransformPairsIntoTempClasses( Vec_Int_t * vPairs, int nObjNumMax )
{
    Vec_Int_t ** pvClasses;   // vector of classes
    int * pReprs;             // mapping nodes into their representatives
    int Entry, idObj, idRepr, idReprObj, idReprRepr, i;
    // allocate data-structures
    pvClasses = ABC_CALLOC( Vec_Int_t *, nObjNumMax );
    pReprs    = ABC_ALLOC( int, nObjNumMax );
    for ( i = 0; i < nObjNumMax; i++ )
        pReprs[i] = -1;
    // consider pairs
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        // get both objects
        idRepr = Vec_IntEntry( vPairs, i   );
        idObj  = Vec_IntEntry( vPairs, i+1 );
        assert( idObj > 0 );
        assert( (pReprs[idRepr] == -1) || (pvClasses[pReprs[idRepr]] != NULL) );
        assert( (pReprs[idObj]  == -1) || (pvClasses[pReprs[idObj] ] != NULL) );
        // get representatives of both objects
        idReprRepr = pReprs[idRepr];
        idReprObj  = pReprs[idObj];
        // check different situations
        if ( idReprRepr == -1 && idReprObj == -1 )
        {   // they do not have classes
            // create a class
            pvClasses[idRepr] = Vec_IntAlloc( 4 );
            Vec_IntPush( pvClasses[idRepr], idRepr );
            Vec_IntPush( pvClasses[idRepr], idObj );
            pReprs[ idRepr ] = idRepr;
            pReprs[ idObj  ] = idRepr;
        }
        else if ( idReprRepr >= 0 && idReprObj == -1 )
        {   // representative has a class
            // add iObj to the same class
            Vec_IntPushUniqueOrder( pvClasses[idReprRepr], idObj );
            pReprs[ idObj ] = idReprRepr;
        }
        else if ( idReprRepr == -1 && idReprObj >= 0 )
        {   // object has a class
            assert( idReprObj != idRepr );
            if ( idReprObj < idRepr )
            { // add idRepr to the same class
                Vec_IntPushUniqueOrder( pvClasses[idReprObj], idRepr );
                pReprs[ idRepr ] = idReprObj;
            }
            else // if ( idReprObj > idRepr )
            { // make idRepr new representative
                Vec_IntPushFirst( pvClasses[idReprObj], idRepr );
                pvClasses[idRepr] = pvClasses[idReprObj];
                pvClasses[idReprObj] = NULL;
                // set correct representatives of each node
                Vec_IntForEachEntry( pvClasses[idRepr], Entry, i )
                    pReprs[ Entry ] = idRepr;
            }
        }
        else // if ( idReprRepr >= 0 && idReprObj >= 0 )
        {   // both have classes
            if ( idReprRepr == idReprObj )
            {  // the classes are the same
                // nothing to do
            }
            else
            {  // the classes are different
                // find the repr of the new class
                if ( idReprRepr < idReprObj )
                {
                    Vec_IntForEachEntry( pvClasses[idReprObj], Entry, i )
                    {
                        Vec_IntPushUniqueOrder( pvClasses[idReprRepr], Entry );
                        pReprs[ Entry ] = idReprRepr;
                    }
                    Vec_IntFree( pvClasses[idReprObj] );
                    pvClasses[idReprObj] = NULL;
                }
                else // if ( idReprRepr > idReprObj )
                {
                    Vec_IntForEachEntry( pvClasses[idReprRepr], Entry, i )
                    {
                        Vec_IntPushUniqueOrder( pvClasses[idReprObj], Entry );
                        pReprs[ Entry ] = idReprObj;
                    }
                    Vec_IntFree( pvClasses[idReprRepr] );
                    pvClasses[idReprRepr] = NULL;
                }
            }
        }
    }
    ABC_FREE( pReprs );
    return pvClasses;
}